

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

ssh_keyalg * find_pubkey_alg_len(ptrlen name)

{
  _Bool _Var1;
  ulong local_28;
  size_t i;
  ptrlen name_local;
  
  local_28 = 0;
  while( true ) {
    if (0x10 < local_28) {
      return (ssh_keyalg *)0x0;
    }
    _Var1 = ptrlen_eq_string(name,all_keyalgs[local_28]->ssh_id);
    if (_Var1) break;
    local_28 = local_28 + 1;
  }
  return all_keyalgs[local_28];
}

Assistant:

const ssh_keyalg *find_pubkey_alg_len(ptrlen name)
{
    for (size_t i = 0; i < n_keyalgs; i++)
        if (ptrlen_eq_string(name, all_keyalgs[i]->ssh_id))
            return all_keyalgs[i];

    return NULL;
}